

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_dispatcher.cpp
# Opt level: O0

void __thiscall
cppcms::url_dispatcher::assign_generic(url_dispatcher *this,string *expr,rhandler *h)

{
  string *in_RSI;
  hold_ptr<cppcms::url_dispatcher::_data> *in_RDI;
  int unaff_retaddr;
  int in_stack_00000008;
  int in_stack_0000000c;
  function<void_(const_booster::match_results<const_char_*>_&)> *in_stack_00000010;
  string *in_stack_00000018;
  int in_stack_00000030;
  int in_stack_00000038;
  int in_stack_00000040;
  undefined4 uVar1;
  undefined4 in_stack_ffffffffffffff7c;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffff84;
  string local_48 [56];
  string *local_10;
  
  local_10 = in_RSI;
  booster::hold_ptr<cppcms::url_dispatcher::_data>::operator->(in_RDI);
  std::__cxx11::string::string(local_48,local_10);
  uVar2 = 0;
  uVar1 = 0;
  (anonymous_namespace)::
  make_handler<std::function<void(booster::match_results<char_const*>const&)>>
            (in_stack_00000018,in_stack_00000010,in_stack_0000000c,in_stack_00000008,unaff_retaddr,
             in_stack_00000030,in_stack_00000038,in_stack_00000040);
  std::
  vector<std::shared_ptr<cppcms::(anonymous_namespace)::option>,_std::allocator<std::shared_ptr<cppcms::(anonymous_namespace)::option>_>_>
  ::push_back((vector<std::shared_ptr<cppcms::(anonymous_namespace)::option>,_std::allocator<std::shared_ptr<cppcms::(anonymous_namespace)::option>_>_>
               *)CONCAT44(in_stack_ffffffffffffff84,uVar2),
              (value_type *)CONCAT44(in_stack_ffffffffffffff7c,uVar1));
  std::shared_ptr<cppcms::(anonymous_namespace)::option>::~shared_ptr
            ((shared_ptr<cppcms::(anonymous_namespace)::option> *)0x3b3c99);
  std::__cxx11::string::~string(local_48);
  return;
}

Assistant:

void url_dispatcher::assign_generic(std::string const &expr,rhandler h)
	{
		d->options.push_back(make_handler(expr,h));
	}